

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IImage.h
# Opt level: O0

void __thiscall irr::video::IImage::setMipMapsData(IImage *this,void *data,bool ownForeignMemory)

{
  u32 uVar1;
  void *pvVar2;
  byte in_DL;
  void *in_RSI;
  long in_RDI;
  u32 height;
  u32 width;
  u32 dataSize;
  undefined3 uVar3;
  u32 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  if (in_RSI != *(void **)(in_RDI + 0x20)) {
    if ((*(byte *)(in_RDI + 0x31) & 1) != 0) {
      in_stack_ffffffffffffffd0 = *(void **)(in_RDI + 0x20);
      if (in_stack_ffffffffffffffd0 != (void *)0x0) {
        operator_delete__(in_stack_ffffffffffffffd0);
      }
      *(undefined1 *)(in_RDI + 0x31) = 0;
    }
    if (in_RSI == (void *)0x0) {
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
    else if ((in_DL & 1) == 0) {
      local_18 = 0;
      local_1c = *(uint *)(in_RDI + 0xc);
      local_20 = *(uint *)(in_RDI + 0x10);
      do {
        if (1 < local_1c) {
          local_1c = local_1c >> 1;
        }
        if (1 < local_20) {
          local_20 = local_20 >> 1;
        }
        uVar1 = getDataSizeFromFormat
                          ((ECOLOR_FORMAT)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                           (u32)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        local_18 = uVar1 + local_18;
        uVar3 = (undefined3)in_stack_ffffffffffffffcc;
        in_stack_ffffffffffffffcc = CONCAT13(1,uVar3);
        if (local_1c == 1) {
          in_stack_ffffffffffffffcc = CONCAT13(local_20 != 1,uVar3);
        }
      } while ((char)(in_stack_ffffffffffffffcc >> 0x18) != '\0');
      pvVar2 = operator_new__((ulong)local_18);
      *(void **)(in_RDI + 0x20) = pvVar2;
      memcpy(*(void **)(in_RDI + 0x20),in_RSI,(ulong)local_18);
      *(undefined1 *)(in_RDI + 0x31) = 1;
    }
    else {
      *(void **)(in_RDI + 0x20) = in_RSI;
      *(undefined1 *)(in_RDI + 0x31) = 0;
    }
  }
  return;
}

Assistant:

void setMipMapsData(void *data, bool ownForeignMemory)
	{
		if (data != MipMapsData) {
			if (DeleteMipMapsMemory) {
				delete[] MipMapsData;

				DeleteMipMapsMemory = false;
			}

			if (data) {
				if (ownForeignMemory) {
					MipMapsData = static_cast<u8 *>(data);

					DeleteMipMapsMemory = false;
				} else {
					u32 dataSize = 0;
					u32 width = Size.Width;
					u32 height = Size.Height;

					do {
						if (width > 1)
							width >>= 1;

						if (height > 1)
							height >>= 1;

						dataSize += getDataSizeFromFormat(Format, width, height);
					} while (width != 1 || height != 1);

					MipMapsData = new u8[dataSize];
					memcpy(MipMapsData, data, dataSize);

					DeleteMipMapsMemory = true;
				}
			} else {
				MipMapsData = 0;
			}
		}
	}